

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::Image::uploadUsingBuffer
          (Image *this,VkQueue queue,Allocator *allocator,VkImageLayout layout,VkOffset3D offset,
          int width,int height,int depth,uint mipLevel,uint arrayElement,
          VkImageAspectFlagBits aspect,void *data)

{
  Allocation *pAVar1;
  void *__dest;
  VkQueue pVVar2;
  bool bVar3;
  int iVar4;
  VkResult VVar5;
  TextureFormat TVar6;
  VkDeviceSize _size;
  SharedPtr<vkt::Draw::Buffer> stagingResource;
  VkSubmitInfo submitInfo;
  Allocation local_148;
  undefined8 local_128;
  deInt32 local_120;
  int local_11c;
  int local_118;
  int local_114;
  RefBase<vk::VkCommandBuffer_s_*> local_108;
  VkQueue local_e8;
  undefined8 local_e0;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_d8;
  CmdPoolCreateInfo copyCmdPoolCreateInfo;
  CmdBufferBeginInfo beginInfo;
  BufferCreateInfo stagingBufferResourceCreateInfo;
  
  local_e0 = offset._0_8_;
  stagingResource.m_ptr = (Buffer *)0x0;
  stagingResource.m_state = (SharedPtrStateBase *)0x0;
  TVar6 = ::vk::mapVkFormat(this->m_format);
  bVar3 = tcu::isCombinedDepthStencilType(TVar6.type);
  local_e8 = queue;
  if (bVar3) {
    iVar4 = 0;
    switch(this->m_format) {
    case VK_FORMAT_X8_D24_UNORM_PACK32:
    case VK_FORMAT_D24_UNORM_S8_UINT:
      iVar4 = (uint)(aspect == VK_IMAGE_ASPECT_DEPTH_BIT) * 2 + 1;
      break;
    case VK_FORMAT_D16_UNORM_S8_UINT:
      iVar4 = (aspect == VK_IMAGE_ASPECT_DEPTH_BIT) + 1;
      break;
    case VK_FORMAT_D32_SFLOAT_S8_UINT:
      iVar4 = (uint)(aspect == VK_IMAGE_ASPECT_DEPTH_BIT) * 3 + 1;
    }
  }
  else {
    stagingBufferResourceCreateInfo.super_VkBufferCreateInfo._0_8_ =
         ::vk::mapVkFormat(this->m_format);
    iVar4 = tcu::TextureFormat::getPixelSize((TextureFormat *)&stagingBufferResourceCreateInfo);
  }
  _size = (VkDeviceSize)(iVar4 * depth * height * width);
  BufferCreateInfo::BufferCreateInfo
            (&stagingBufferResourceCreateInfo,_size,3,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0)
  ;
  Draw::Buffer::createAndAlloc
            ((Buffer *)&submitInfo,this->m_vk,this->m_device,
             &stagingBufferResourceCreateInfo.super_VkBufferCreateInfo,allocator,
             (MemoryRequirement)0x1);
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (&stagingResource,(SharedPtr<vkt::Draw::Buffer> *)&submitInfo);
  de::SharedPtr<vkt::Draw::Buffer>::release((SharedPtr<vkt::Draw::Buffer> *)&submitInfo);
  pAVar1 = ((stagingResource.m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  submitInfo._0_8_ = &PTR__Allocation_00bf5e28;
  submitInfo.pNext = (void *)(pAVar1->m_memory).m_internal;
  submitInfo._16_8_ = pAVar1->m_offset;
  __dest = pAVar1->m_hostPtr;
  submitInfo.pWaitSemaphores._0_4_ = SUB84(__dest,0);
  submitInfo.pWaitSemaphores._4_4_ = (undefined4)((ulong)__dest >> 0x20);
  ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
  memcpy(__dest,data,_size);
  pAVar1 = ((stagingResource.m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  submitInfo._0_8_ = &PTR__Allocation_00bf5e28;
  submitInfo.pNext = (void *)(pAVar1->m_memory).m_internal;
  submitInfo._16_8_ = pAVar1->m_offset;
  submitInfo.pWaitSemaphores._0_4_ = SUB84(pAVar1->m_hostPtr,0);
  submitInfo.pWaitSemaphores._4_4_ = (undefined4)((ulong)pAVar1->m_hostPtr >> 0x20);
  pAVar1 = ((stagingResource.m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_148._vptr_Allocation = (_func_int **)&PTR__Allocation_00bf5e28;
  local_148.m_memory.m_internal = (pAVar1->m_memory).m_internal;
  local_148.m_offset = pAVar1->m_offset;
  local_148.m_hostPtr = pAVar1->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (this->m_vk,this->m_device,(VkDeviceMemory)submitInfo.pNext,local_148.m_offset,_size);
  ::vk::Allocation::~Allocation(&local_148);
  ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
  CmdPoolCreateInfo::CmdPoolCreateInfo(&copyCmdPoolCreateInfo,0,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,this->m_vk,this->m_device,
             &copyCmdPoolCreateInfo.super_VkCommandPoolCreateInfo,(VkAllocationCallbacks *)0x0);
  local_d8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(submitInfo.pWaitSemaphores._4_4_,submitInfo.pWaitSemaphores._0_4_);
  local_d8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_d8.m_data.object.m_internal = submitInfo._0_8_;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&submitInfo);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,this->m_vk,this->m_device,
             (VkCommandPool)local_d8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_108.m_data.deleter.m_pool.m_internal =
       CONCAT44(submitInfo.pWaitSemaphores._4_4_,submitInfo.pWaitSemaphores._0_4_);
  local_108.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_108.m_data.object = (VkCommandBuffer_s *)submitInfo._0_8_;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&submitInfo);
  CmdBufferBeginInfo::CmdBufferBeginInfo(&beginInfo,0);
  VVar5 = (*this->m_vk->_vptr_DeviceInterface[0x49])(this->m_vk,local_108.m_data.object,&beginInfo);
  ::vk::checkResult(VVar5,"m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x2b3);
  if (layout == VK_IMAGE_LAYOUT_UNDEFINED) {
    submitInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    submitInfo.pNext = (void *)0x0;
    submitInfo.waitSemaphoreCount = 0;
    submitInfo._20_4_ = 0;
    submitInfo.pWaitSemaphores._0_4_ = 0;
    submitInfo.pWaitSemaphores._4_4_ = 1;
    submitInfo.pWaitDstStageMask._0_4_ = 0xffffffff;
    submitInfo.pWaitDstStageMask._4_4_ = 0xffffffff;
    submitInfo._40_8_ =
         (this->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    submitInfo.pCommandBuffers = (VkCommandBuffer *)(ulong)aspect;
    submitInfo._60_4_ = 0;
    submitInfo.signalSemaphoreCount = this->m_levelCount;
    submitInfo.pSignalSemaphores =
         (VkSemaphore *)CONCAT44(submitInfo.pSignalSemaphores._4_4_,this->m_layerCount);
    layout = VK_IMAGE_LAYOUT_GENERAL;
    (*this->m_vk->_vptr_DeviceInterface[0x6d])
              (this->m_vk,local_108.m_data.object,0x8000,1,0,0,0,0,0,1,&submitInfo);
  }
  local_148._vptr_Allocation = (_func_int **)0x0;
  local_148.m_memory.m_internal = 0;
  local_148.m_offset = CONCAT44(mipLevel,aspect);
  local_148.m_hostPtr = (void *)CONCAT44(1,arrayElement);
  local_128 = local_e0;
  local_11c = width;
  local_118 = height;
  local_114 = depth;
  local_120 = offset.z;
  (*this->m_vk->_vptr_DeviceInterface[0x62])
            (this->m_vk,local_108.m_data.object,
             ((stagingResource.m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
             m_data.object.m_internal,
             (this->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
             ,(ulong)layout,1,&local_148);
  VVar5 = (*this->m_vk->_vptr_DeviceInterface[0x4a])(this->m_vk,local_108.m_data.object);
  ::vk::checkResult(VVar5,"m_vk.endCommandBuffer(*copyCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x2d9);
  pVVar2 = local_e8;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask._0_4_ = 0;
  submitInfo.pWaitDstStageMask._4_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&local_108;
  (*this->m_vk->_vptr_DeviceInterface[2])(this->m_vk,local_e8,1,&submitInfo,0);
  VVar5 = (*this->m_vk->_vptr_DeviceInterface[3])(this->m_vk,pVVar2);
  ::vk::checkResult(VVar5,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x2ea);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_108);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_d8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&stagingBufferResourceCreateInfo.m_queueFamilyIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  de::SharedPtr<vkt::Draw::Buffer>::release(&stagingResource);
  return;
}

Assistant:

void Image::uploadUsingBuffer (vk::VkQueue					queue,
							   vk::Allocator&				allocator,
							   vk::VkImageLayout			layout,
							   vk::VkOffset3D				offset,
							   int							width,
							   int							height,
							   int							depth,
							   unsigned int					mipLevel,
							   unsigned int					arrayElement,
							   vk::VkImageAspectFlagBits	aspect,
							   const void *					data)
{
	DE_ASSERT(layout == vk::VK_IMAGE_LAYOUT_GENERAL || layout == vk::VK_IMAGE_LAYOUT_UNDEFINED || layout == vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);

	de::SharedPtr<Buffer> stagingResource;
	bool isCombinedType = isCombinedDepthStencilType(vk::mapVkFormat(m_format).type);
	vk::VkDeviceSize bufferSize = 0;
	if (!isCombinedType)
		bufferSize = vk::mapVkFormat(m_format).getPixelSize() *width*height*depth;
	if (isCombinedType)
	{
		int pixelSize = 0;
		switch (m_format)
		{
			case vk::VK_FORMAT_D16_UNORM_S8_UINT:
				pixelSize = (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT) ? 2 : 1;
				break;
			case  vk::VK_FORMAT_D32_SFLOAT_S8_UINT:
				pixelSize = (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT) ? 4 : 1;
				break;
			case vk::VK_FORMAT_X8_D24_UNORM_PACK32:
			case vk::VK_FORMAT_D24_UNORM_S8_UINT:
				pixelSize = (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT) ? 3 : 1;
				break;

			default:
				DE_FATAL("Not implemented");
		}
		bufferSize = pixelSize*width*height*depth;
	}
	BufferCreateInfo stagingBufferResourceCreateInfo(bufferSize, vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT | vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT);
	stagingResource = Buffer::createAndAlloc(m_vk, m_device, stagingBufferResourceCreateInfo, allocator, vk::MemoryRequirement::HostVisible);
	deUint8* destPtr = reinterpret_cast<deUint8*>(stagingResource->getBoundMemory().getHostPtr());
	deMemcpy(destPtr, data, static_cast<size_t>(bufferSize));
	vk::flushMappedMemoryRange(m_vk, m_device, stagingResource->getBoundMemory().getMemory(), stagingResource->getBoundMemory().getOffset(), bufferSize);
	{
		//todo [scygan] get proper queueFamilyIndex
		CmdPoolCreateInfo copyCmdPoolCreateInfo(0);
		vk::Unique<vk::VkCommandPool> copyCmdPool(vk::createCommandPool(m_vk, m_device, &copyCmdPoolCreateInfo));
		vk::Unique<vk::VkCommandBuffer> copyCmdBuffer(vk::allocateCommandBuffer(m_vk, m_device, *copyCmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		CmdBufferBeginInfo beginInfo;
		VK_CHECK(m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo));

		if (layout == vk::VK_IMAGE_LAYOUT_UNDEFINED)
		{
			layout = vk::VK_IMAGE_LAYOUT_GENERAL;

			vk::VkImageMemoryBarrier barrier;
			barrier.sType = vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
			barrier.pNext = DE_NULL;
			barrier.srcAccessMask = 0;
			barrier.dstAccessMask = 0;
			barrier.oldLayout = vk::VK_IMAGE_LAYOUT_UNDEFINED;
			barrier.newLayout = vk::VK_IMAGE_LAYOUT_GENERAL;
			barrier.srcQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED;
			barrier.dstQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED;
			barrier.image = object();

			barrier.subresourceRange.aspectMask = aspect;
			barrier.subresourceRange.baseMipLevel = 0;
			barrier.subresourceRange.levelCount = m_levelCount;
			barrier.subresourceRange.baseArrayLayer = 0;
			barrier.subresourceRange.layerCount = m_layerCount;

			m_vk.cmdPipelineBarrier(*copyCmdBuffer, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
									0, (const vk::VkMemoryBarrier*)DE_NULL,
									0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
									1, &barrier);
		}

		vk::VkBufferImageCopy region = {
			0, 0, 0,
			{ (vk::VkImageAspectFlags)aspect, mipLevel, arrayElement, 1 },
			offset,
			{ (deUint32)width, (deUint32)height, (deUint32)depth }
		};

		m_vk.cmdCopyBufferToImage(*copyCmdBuffer, stagingResource->object(),
			object(), layout, 1, &region);
		VK_CHECK(m_vk.endCommandBuffer(*copyCmdBuffer));

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&copyCmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// TODO: make this less intrusive
		VK_CHECK(m_vk.queueWaitIdle(queue));
	}
}